

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O0

void __thiscall vec<BoolView>::vec<BoolView>(vec<BoolView> *this,vec<BoolView> *other)

{
  uint uVar1;
  void *pvVar2;
  BoolView *pBVar3;
  vec<BoolView> *in_RSI;
  BoolView *in_RDI;
  uint i;
  uint local_14;
  
  uVar1 = size(in_RSI);
  *(uint *)&(in_RDI->super_Var).super_Branching._vptr_Branching = uVar1;
  *(undefined4 *)((long)&(in_RDI->super_Var).super_Branching._vptr_Branching + 4) =
       *(undefined4 *)&(in_RDI->super_Var).super_Branching._vptr_Branching;
  pvVar2 = malloc((ulong)*(uint *)((long)&(in_RDI->super_Var).super_Branching._vptr_Branching + 4)
                  << 4);
  *(void **)&in_RDI->v = pvVar2;
  for (local_14 = 0; local_14 < *(uint *)&(in_RDI->super_Var).super_Branching._vptr_Branching;
      local_14 = local_14 + 1) {
    pBVar3 = (BoolView *)(*(long *)&in_RDI->v + (ulong)local_14 * 0x10);
    operator[](in_RSI,local_14);
    BoolView::BoolView(in_RDI,pBVar3);
  }
  return;
}

Assistant:

vec(vec<U>& other) : sz(other.size()), cap(sz) {
		assert(sizeof(U) == sizeof(T));
		data = (T*)malloc(cap * sizeof(T));
		for (unsigned int i = 0; i < sz; i++) {
			new (&data[i]) T(other[i]);
		}
		//		for (int i = 0; i < sz; i++) data[i] = other[i];
	}